

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::(anonymous_namespace)::TestCase3969::run()::WebSocketApplicationErrorService::
handleApplicationError(kj::Exception,kj::Maybe<kj::HttpService::Response_>_
          (void *this,Exception *exception,Maybe<kj::HttpService::Response_&> *response)

{
  bool bVar1;
  bool local_a9;
  undefined1 auStack_a8 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  undefined1 local_78 [8];
  DebugComparison<kj::StringPtr,_kj::StringPtr> _kjCondition_1;
  DebugExpression<bool_&> DStack_38;
  bool _kj_shouldLog;
  DebugExpression<bool_&> _kjCondition;
  bool responseWasSent;
  Maybe<kj::HttpService::Response_&> *response_local;
  Exception *exception_local;
  WebSocketApplicationErrorService *this_local;
  
  _kjCondition.value._7_1_ = Maybe<kj::HttpService::Response_&>::operator==();
  DStack_38 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (bool *)((long)&_kjCondition.value + 7));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xffffffffffffffc8)
  ;
  if (!bVar1) {
    _kjCondition_1._55_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._55_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0xf99,ERROR,"\"failed: expected \" \"responseWasSent\", _kjCondition",
                 (char (*) [33])"failed: expected responseWasSent",&stack0xffffffffffffffc8);
      _kjCondition_1._55_1_ = 0;
    }
  }
  local_98 = (ArrayPtr<const_char>)Exception::getDescription((Exception *)response);
  local_88 = (ArrayPtr<const_char>)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)&local_98);
  _auStack_a8 = (ArrayPtr<const_char>)operator____kj("test exception",0xe);
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_kj::StringPtr> *)local_78,
             (DebugExpression<kj::StringPtr> *)&local_88,(StringPtr *)auStack_a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_78);
  if (!bVar1) {
    local_a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_a9 != false) {
      kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<kj::StringPtr,kj::StringPtr>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0xf9a,ERROR,
                 "\"failed: expected \" \"exception.getDescription() == \\\"test exception\\\"_kj\", _kjCondition"
                 ,(char (*) [67])
                  "failed: expected exception.getDescription() == \"test exception\"_kj",
                 (DebugComparison<kj::StringPtr,_kj::StringPtr> *)local_78);
      local_a9 = false;
    }
  }
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> handleApplicationError(Exception exception, Maybe<Response&> response) override {
      // We accepted the WebSocket, so the response was already sent. At one time, we _did_ expose a
      // useless Response reference here, so this is a regression test.
      bool responseWasSent = response == kj::none;
      KJ_EXPECT(responseWasSent);
      KJ_EXPECT(exception.getDescription() == "test exception"_kj);
      return READY_NOW;
    }